

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

ll128 * __thiscall Constant::Util::power(ll128 *__return_storage_ptr__,Util *this,ll128 a,ll128 b)

{
  undefined1 a_00 [16];
  undefined1 auVar1 [16];
  ll128 *plVar3;
  ll128 *plVar4;
  undefined8 unaff_RBX;
  undefined1 auVar5 [16];
  ulong uVar2;
  
  auVar5 = __modti3();
  uVar2 = auVar5._0_8_;
  auVar1._8_8_ = auVar5._8_8_ + (ulong)(0xfe9cba87a275fffc < uVar2);
  auVar1._0_8_ = uVar2 + 0x16345785d8a0003;
  if ((ulong)(0xfe9cba87a275fffc < uVar2) <= -auVar5._8_8_ - 1U) {
    auVar1 = auVar5;
  }
  if (auVar1._0_8_ == 0 && auVar1._8_8_ == 0) {
    plVar3 = (ll128 *)0x1;
  }
  else {
    auVar5 = __modti3(__return_storage_ptr__,this,0x16345785d8a0003,0);
    plVar3 = auVar5._0_8_;
    plVar4 = (ll128 *)((long)plVar3 + 0x16345785d8a0003);
    if ((ulong)((ll128 *)0xfe9cba87a275fffc < plVar3) <= -auVar5._8_8_ - 1U) {
      plVar4 = plVar3;
    }
    plVar3 = (ll128 *)0x1;
    for (; auVar1._0_8_ != 0 || auVar1._8_8_ != 0; auVar1 = auVar1 >> 1) {
      if ((auVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar3 = (ll128 *)((long)plVar4 * (long)plVar3);
      }
      auVar5._8_8_ = unaff_RBX;
      auVar5._0_8_ = this;
      plVar3 = get_residual(plVar3,(ll128)auVar5);
      a_00._8_8_ = unaff_RBX;
      a_00._0_8_ = this;
      plVar4 = get_residual((ll128 *)((long)plVar4 * (long)plVar4),(ll128)a_00);
    }
  }
  return plVar3;
}

Assistant:

ll128 Constant::Util::power(ll128 a, ll128 b) {
    ll128 ret = 1;
    a = (a%MOD+MOD)%MOD;
    b = (b%MOD+MOD)%MOD;
    if (b == 0)
        return 1;
    while (b > 0) {
        if (b&1) ret = ret * a;
        ret = get_residual(ret);
        a = a * a;
        a = get_residual(a);
        b >>= 1;
    }
    return ret;
}